

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QObject::removeEventFilter(QObject *this,QObject *obj)

{
  _func_int **pp_Var1;
  Data *pDVar2;
  iterator iVar3;
  iterator iVar4;
  QObject *pQVar5;
  QList<QPointer<QObject>_> *this_00;
  
  pp_Var1 = (this->d_ptr).d[1]._vptr_QObjectData;
  if (pp_Var1 != (_func_int **)0x0) {
    this_00 = (QList<QPointer<QObject>_> *)(pp_Var1 + 9);
    iVar3 = QList<QPointer<QObject>_>::begin(this_00);
    iVar4 = QList<QPointer<QObject>_>::end(this_00);
    for (; iVar3.i != iVar4.i; iVar3.i = iVar3.i + 1) {
      pDVar2 = ((iVar3.i)->wp).d;
      if (pDVar2 == (Data *)0x0) {
        if (obj == (QObject *)0x0) {
          ((iVar3.i)->wp).d = (Data *)0x0;
          ((iVar3.i)->wp).value = (QObject *)0x0;
          return;
        }
      }
      else {
        if ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0) {
          pQVar5 = (QObject *)0x0;
        }
        else {
          pQVar5 = ((iVar3.i)->wp).value;
        }
        if (pQVar5 == obj) {
          ((iVar3.i)->wp).d = (Data *)0x0;
          ((iVar3.i)->wp).value = (QObject *)0x0;
          LOCK();
          (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
               (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i != 0) {
            return;
          }
          operator_delete(pDVar2);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }